

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

void voc_make_obj_name_from_list
               (voccxdef *ctx,char *namebuf,char **cmd,char *firstwrd,char *lastwrd)

{
  char **in_RCX;
  char *in_RDX;
  voccxdef *in_RSI;
  undefined8 in_R8;
  bool bVar1;
  int i2;
  int i1;
  int i;
  int local_2c;
  
  local_2c = 0;
  while( true ) {
    bVar1 = false;
    if (*(long *)(in_RDX + (long)local_2c * 8) != 0) {
      bVar1 = **(char **)(in_RDX + (long)local_2c * 8) != '\0';
    }
    if (!bVar1) break;
    local_2c = local_2c + 1;
  }
  voc_make_obj_name(in_RSI,in_RDX,in_RCX,(int)((ulong)in_R8 >> 0x20),(int)in_R8);
  return;
}

Assistant:

void voc_make_obj_name_from_list(voccxdef *ctx, char *namebuf,
                                 char *cmd[], char *firstwrd, char *lastwrd)
{
    int i, i1, i2;
    
    /* find the cmd indices */
    for (i = i1 = i2 = 0 ; cmd[i] != 0 && *cmd[i] != 0 ; ++i)
    {
        if (cmd[i] == firstwrd)
            i1 = i;
        if (cmd[i] == lastwrd)
            i2 = i + 1;
    }

    /* build the name */
    voc_make_obj_name(ctx, namebuf, cmd, i1, i2);
}